

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::AST_Node::pretty_print_abi_cxx11_(string *__return_storage_ptr__,AST_Node *this)

{
  bool bVar1;
  AST_Node *this_00;
  ostream *poVar2;
  string local_1f8;
  reference local_1d8;
  reference_wrapper<chaiscript::AST_Node> *elem;
  iterator __end2;
  iterator __begin2;
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  *__range2;
  ostringstream local_190 [8];
  ostringstream oss;
  AST_Node *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)&this->text);
  (**this->_vptr_AST_Node)(&__begin2);
  __end2 = std::
           vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
           ::begin((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                    *)&__begin2);
  elem = (reference_wrapper<chaiscript::AST_Node> *)
         std::
         vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
         ::end((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
                *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                      (&__end2,(__normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1d8 = __gnu_cxx::
                __normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
                ::operator*(&__end2);
    this_00 = std::reference_wrapper<chaiscript::AST_Node>::get(local_1d8);
    pretty_print_abi_cxx11_(&local_1f8,this_00);
    poVar2 = std::operator<<((ostream *)local_190,(string *)&local_1f8);
    std::operator<<(poVar2,' ');
    std::__cxx11::string::~string((string *)&local_1f8);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  ::~vector((vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
             *)&__begin2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const {
      std::ostringstream oss;

      oss << text;

      for (auto &elem : get_children()) {
        oss << elem.get().pretty_print() << ' ';
      }

      return oss.str();
    }